

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
ManchesterSimulationDataGenerator::SimWriteBit(ManchesterSimulationDataGenerator *this,U32 bit)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (int)this + 0x20;
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  switch(this->mSettings->mMode) {
  case MANCHESTER:
    if (this->mSettings->mInverted == false) {
      if ((iVar1 == 1 && bit == 0) || (bit == 1 && iVar1 == 0)) goto LAB_001084da;
    }
    else if (iVar1 == 0 && bit == 0 || bit == 1 && iVar1 == 1) {
LAB_001084da:
      SimulationChannelDescriptor::Transition();
    }
    goto LAB_001084e2;
  case DIFFERENTIAL_MANCHESTER:
    if (bit == 0) goto LAB_001084da;
LAB_001084e2:
    SimulationChannelDescriptor::Advance(uVar2);
    break;
  case BI_PHASE_MARK:
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(uVar2);
    if (bit != 1) goto LAB_001084f5;
    break;
  case BI_PHASE_SPACE:
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(uVar2);
    if (bit != 0) goto LAB_001084f5;
    break;
  default:
    return;
  }
  SimulationChannelDescriptor::Transition();
LAB_001084f5:
  SimulationChannelDescriptor::Advance(uVar2);
  return;
}

Assistant:

void ManchesterSimulationDataGenerator::SimWriteBit( U32 bit )
{
    BitState start_bit_state = mManchesterSimulationData.GetCurrentBitState();
    switch( mSettings->mMode )
    {
    case MANCHESTER:
    {
        if( mSettings->mInverted == false )
        {
            if( ( bit == 0 ) && ( start_bit_state == BIT_HIGH ) )
                mManchesterSimulationData.Transition();
            else if( ( bit == 1 ) && ( start_bit_state == BIT_LOW ) )
                mManchesterSimulationData.Transition();
        }
        else
        {
            if( ( bit == 1 ) && ( start_bit_state == BIT_HIGH ) )
                mManchesterSimulationData.Transition();
            else if( ( bit == 0 ) && ( start_bit_state == BIT_LOW ) )
                mManchesterSimulationData.Transition();
        }
        mManchesterSimulationData.Advance( U32( mT ) );
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    case DIFFERENTIAL_MANCHESTER:
    {
        if( bit == 0 )
            mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    case BI_PHASE_MARK:
    {
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
        if( bit == 1 )
            mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    case BI_PHASE_SPACE:
    {
        mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
        if( bit == 0 )
            mManchesterSimulationData.Transition();
        mManchesterSimulationData.Advance( U32( mT ) );
    }
    break;
    }
}